

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::Server::write_response
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  Response *this_00;
  Stream *pSVar1;
  bool bVar2;
  int *args;
  ulong uVar3;
  unsigned_long __val;
  char *val;
  undefined8 uVar4;
  undefined8 uVar5;
  bool local_99;
  undefined1 local_80 [8];
  string length;
  string local_58;
  char *local_38;
  Response *local_30;
  Response *res_local;
  Request *req_local;
  Stream *pSStack_18;
  bool last_connection_local;
  Stream *strm_local;
  Server *this_local;
  
  local_30 = res;
  res_local = (Response *)req;
  req_local._7_1_ = last_connection;
  pSStack_18 = strm;
  strm_local = (Stream *)this;
  if (res->status == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/contrib/httplib/httplib.h"
                  ,0x5fa,
                  "void httplib::Server::write_response(Stream &, bool, const Request &, Response &)"
                 );
  }
  if ((399 < res->status) &&
     (bVar2 = std::function::operator_cast_to_bool((function *)&this->error_handler_), bVar2)) {
    std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
              (&this->error_handler_,(Request *)res_local,local_30);
  }
  pSVar1 = pSStack_18;
  args = &local_30->status;
  local_38 = detail::status_message(local_30->status);
  Stream::write_format<int,char_const*>(pSVar1,"HTTP/1.1 %d %s\r\n",args,&local_38);
  length.field_2._M_local_buf[0xf] = '\0';
  local_99 = true;
  if ((req_local._7_1_ & 1) == 0) {
    bVar2 = std::operator==(&res_local->version,"HTTP/1.0");
    local_99 = true;
    if (!bVar2) {
      Request::get_header_value_abi_cxx11_(&local_58,(Request *)res_local,"Connection");
      length.field_2._M_local_buf[0xf] = '\x01';
      local_99 = std::operator==(&local_58,"close");
    }
  }
  if ((length.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if (local_99 != false) {
    Response::set_header(local_30,"Connection","close");
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar2 = Response::has_header(local_30,"Content-Type");
    if (!bVar2) {
      Response::set_header(local_30,"Content-Type","text/plain");
    }
    __val = std::__cxx11::string::size();
    std::__cxx11::to_string((string *)local_80,__val);
    this_00 = local_30;
    val = (char *)std::__cxx11::string::c_str();
    Response::set_header(this_00,"Content-Length",val);
    std::__cxx11::string::~string((string *)local_80);
  }
  detail::write_headers<httplib::Response>(pSStack_18,local_30);
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &res_local->status,"HEAD"), pSVar1 = pSStack_18, bVar2)) {
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::size();
    (*pSVar1->_vptr_Stream[3])(pSVar1,uVar4,uVar5);
  }
  bVar2 = std::function::operator_cast_to_bool((function *)&this->logger_);
  if (bVar2) {
    std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
              (&this->logger_,(Request *)res_local,local_30);
  }
  return;
}

Assistant:

inline void Server::write_response(Stream& strm, bool last_connection, const Request& req, Response& res)
{
    assert(res.status != -1);

    if (400 <= res.status && error_handler_) {
        error_handler_(req, res);
    }

    // Response line
    strm.write_format("HTTP/1.1 %d %s\r\n",
        res.status,
        detail::status_message(res.status));

    // Headers
    if (last_connection ||
        req.version == "HTTP/1.0" ||
        req.get_header_value("Connection") == "close") {
        res.set_header("Connection", "close");
    }

    if (!res.body.empty()) {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
        // TODO: 'Accpet-Encoding' has gzip, not gzip;q=0
        const auto& encodings = req.get_header_value("Accept-Encoding");
        if (encodings.find("gzip") != std::string::npos &&
            detail::can_compress(res.get_header_value("Content-Type"))) {
            detail::compress(res.body);
            res.set_header("Content-Encoding", "gzip");
        }
#endif

        if (!res.has_header("Content-Type")) {
            res.set_header("Content-Type", "text/plain");
        }

        auto length = std::to_string(res.body.size());
        res.set_header("Content-Length", length.c_str());
    }

    detail::write_headers(strm, res);

    // Body
    if (!res.body.empty() && req.method != "HEAD") {
        strm.write(res.body.c_str(), res.body.size());
    }

    // Log
    if (logger_) {
        logger_(req, res);
    }
}